

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O2

void __thiscall
tst_SerialiserCommon::checkModelEqual
          (tst_SerialiserCommon *this,QAbstractItemModel *a,QAbstractItemModel *b,
          QModelIndex *aParent,QModelIndex *bParent,bool checkHeaders)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int local_e8;
  int local_d4;
  QMap<int,_QVariant> aItemData;
  QMap<int,_QVariant> bItemData;
  QModelIndex aIdx;
  QModelIndex bIdx;
  QArrayDataPointer<int> local_60;
  bool hasChildren;
  
  bVar1 = QModelIndex::isValid(aParent);
  local_d4 = (**(code **)(*(long *)a + 0x78))(a,aParent);
  iVar3 = (**(code **)(*(long *)b + 0x78))(b,bParent);
  cVar2 = QTest::qCompare(iVar3,local_d4,"b->rowCount(bParent)","rowC",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                          ,0x3a);
  if (cVar2 == '\0') {
    return;
  }
  local_e8 = (**(code **)(*(long *)a + 0x80))(a,aParent);
  iVar3 = (**(code **)(*(long *)b + 0x80))(b,bParent);
  cVar2 = QTest::qCompare(iVar3,local_e8,"b->columnCount(bParent)","colC",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                          ,0x3c);
  if (cVar2 == '\0') {
    return;
  }
  if (!bVar1 && checkHeaders) {
    iVar3 = 0;
    if (local_d4 < 1) {
      local_d4 = 0;
    }
    while (local_d4 != iVar3) {
      (**(code **)(*(long *)a + 0xa0))(&aIdx,a,iVar3,2,0);
      (**(code **)(*(long *)b + 0xa0))(&bIdx,b,iVar3,2,0);
      bVar1 = QTest::qCompare<QVariant,QVariant>
                        ((QVariant *)&aIdx,(QVariant *)&bIdx,"a->headerData(i, Qt::Vertical)",
                         "b->headerData(i, Qt::Vertical)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x3f);
      QVariant::~QVariant((QVariant *)&bIdx);
      QVariant::~QVariant((QVariant *)&aIdx);
      if (!bVar1) {
        return;
      }
      (**(code **)(*(long *)a + 0xa0))(&aIdx,a,iVar3,2,0x100);
      (**(code **)(*(long *)b + 0xa0))(&bIdx,b,iVar3,2,0x100);
      bVar1 = QTest::qCompare<QVariant,QVariant>
                        ((QVariant *)&aIdx,(QVariant *)&bIdx,
                         "a->headerData(i, Qt::Vertical, Qt::UserRole)",
                         "b->headerData(i, Qt::Vertical, Qt::UserRole)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x40);
      QVariant::~QVariant((QVariant *)&bIdx);
      QVariant::~QVariant((QVariant *)&aIdx);
      iVar3 = iVar3 + 1;
      if (!bVar1) {
        return;
      }
    }
    iVar3 = 0;
    if (local_e8 < 1) {
      local_e8 = 0;
    }
    while (local_e8 != iVar3) {
      (**(code **)(*(long *)a + 0xa0))(&aIdx,a,iVar3,1,0);
      (**(code **)(*(long *)b + 0xa0))(&bIdx,b,iVar3,1,0);
      bVar1 = QTest::qCompare<QVariant,QVariant>
                        ((QVariant *)&aIdx,(QVariant *)&bIdx,"a->headerData(i, Qt::Horizontal)",
                         "b->headerData(i, Qt::Horizontal)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x43);
      QVariant::~QVariant((QVariant *)&bIdx);
      QVariant::~QVariant((QVariant *)&aIdx);
      if (!bVar1) {
        return;
      }
      (**(code **)(*(long *)a + 0xa0))(&aIdx,a,iVar3,1,0x100);
      (**(code **)(*(long *)b + 0xa0))(&bIdx,b,iVar3,1,0x100);
      bVar1 = QTest::qCompare<QVariant,QVariant>
                        ((QVariant *)&aIdx,(QVariant *)&bIdx,
                         "a->headerData(i, Qt::Horizontal, Qt::UserRole)",
                         "b->headerData(i, Qt::Horizontal, Qt::UserRole)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x44);
      QVariant::~QVariant((QVariant *)&bIdx);
      QVariant::~QVariant((QVariant *)&aIdx);
      iVar3 = iVar3 + 1;
      if (!bVar1) {
        return;
      }
    }
  }
  else {
    if (local_e8 < 1) {
      local_e8 = 0;
    }
    if (local_d4 < 1) {
      local_d4 = 0;
    }
  }
  iVar3 = 0;
  do {
    if (iVar3 == local_d4) {
      return;
    }
    for (iVar4 = 0; local_e8 != iVar4; iVar4 = iVar4 + 1) {
      (**(code **)(*(long *)a + 0x60))(&aIdx,a,iVar3,iVar4,aParent);
      (**(code **)(*(long *)b + 0x60))(&bIdx,b,iVar3,iVar4,bParent);
      (**(code **)(*(long *)a + 0xb0))(&aItemData,a,&aIdx);
      (**(code **)(*(long *)b + 0xb0))(&bItemData,b,&bIdx);
      QMap<int,_QVariant>::keys((QList<int> *)&hasChildren,&bItemData);
      QMap<int,_QVariant>::keys((QList<int> *)&local_60,&aItemData);
      bVar1 = QTest::qCompare<int>
                        ((QList<int> *)&hasChildren,(QList<int> *)&local_60,"bItemData.keys()",
                         "aItemData.keys()",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x4d);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_60);
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&hasChildren);
      if ((!bVar1) ||
         (bVar1 = QTest::qCompare<QMap<int,QVariant>,QMap<int,QVariant>>
                            (&bItemData,&aItemData,"bItemData","aItemData",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                             ,0x4e), !bVar1)) {
LAB_00107c01:
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&bItemData.d);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&aItemData.d);
        return;
      }
      hasChildren = (bool)(**(code **)(*(long *)a + 0x88))(a,&aIdx);
      local_60.d._0_1_ = (**(code **)(*(long *)b + 0x88))(b,&bIdx);
      bVar1 = QTest::qCompare<bool,bool>
                        ((bool *)&local_60,&hasChildren,"b->hasChildren(bIdx)","hasChildren",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x50);
      if (!bVar1) goto LAB_00107c01;
      if (hasChildren == true) {
        checkModelEqual(this,a,b,&aIdx,&bIdx,checkHeaders);
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&bItemData.d);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&aItemData.d);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void tst_SerialiserCommon::checkModelEqual(const QAbstractItemModel *a, const QAbstractItemModel *b, const QModelIndex &aParent,
                                           const QModelIndex &bParent, bool checkHeaders) const
{
    Q_ASSERT(a);
    Q_ASSERT(b);
    const bool aParentValid = aParent.isValid();
    Q_ASSERT(!aParentValid || aParent.model() == a);
    Q_ASSERT(!bParent.isValid() || bParent.model() == b);
    Q_ASSERT(aParentValid == bParent.isValid());
    const int rowC = a->rowCount(aParent);
    QCOMPARE(b->rowCount(bParent), rowC);
    const int colC = a->columnCount(aParent);
    QCOMPARE(b->columnCount(bParent), colC);
    if (!aParentValid && checkHeaders) {
        for (int i = 0; i < rowC; ++i) {
            QCOMPARE(a->headerData(i, Qt::Vertical), b->headerData(i, Qt::Vertical));
            QCOMPARE(a->headerData(i, Qt::Vertical, Qt::UserRole), b->headerData(i, Qt::Vertical, Qt::UserRole));
        }
        for (int i = 0; i < colC; ++i) {
            QCOMPARE(a->headerData(i, Qt::Horizontal), b->headerData(i, Qt::Horizontal));
            QCOMPARE(a->headerData(i, Qt::Horizontal, Qt::UserRole), b->headerData(i, Qt::Horizontal, Qt::UserRole));
        }
    }
    for (int i = 0; i < rowC; ++i) {
        for (int j = 0; j < colC; ++j) {
            const QModelIndex aIdx = a->index(i, j, aParent);
            const QModelIndex bIdx = b->index(i, j, bParent);
            const auto aItemData = a->itemData(aIdx);
            const auto bItemData = b->itemData(bIdx);
            QCOMPARE(bItemData.keys(), aItemData.keys());
            QCOMPARE(bItemData, aItemData);
            const bool hasChildren = a->hasChildren(aIdx);
            QCOMPARE(b->hasChildren(bIdx), hasChildren);
            if (hasChildren) {
                checkModelEqual(a, b, aIdx, bIdx, checkHeaders);
            }
        }
    }
}